

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O0

node * __thiscall
sjtu::
LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
::load(LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
       *this,locType *offset)

{
  size_t sVar1;
  void *pvVar2;
  long lVar3;
  bool bVar4;
  CacheNode *pCVar5;
  size_t sVar6;
  value_type *pvVar7;
  CacheNode *in_RDI;
  CacheNode *tmp;
  CacheNode *node;
  iterator it;
  map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
  *in_stack_fffffffffffff958;
  map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
  *in_stack_fffffffffffff968;
  locType *in_stack_fffffffffffff978;
  LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
  *in_stack_fffffffffffff980;
  LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
  *in_stack_fffffffffffff998;
  locType *in_stack_fffffffffffff9a0;
  node *in_stack_fffffffffffff9a8;
  CacheNode *in_stack_fffffffffffff9b0;
  iterator local_38;
  CacheNode *local_28;
  iterator local_20 [2];
  
  (in_RDI->value).field_0.val[4] = (in_RDI->value).field_0.val[4] + 1;
  map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
  ::find(in_stack_fffffffffffff968,(long *)in_RDI);
  map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
  ::end(in_stack_fffffffffffff958);
  bVar4 = map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
          ::iterator::operator==(local_20,&local_38);
  if (bVar4) {
    (in_RDI->value).field_0.val[5] = (in_RDI->value).field_0.val[5] + 1;
    pCVar5 = (CacheNode *)operator_new(0x670);
    f_read(in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    CacheNode::CacheNode
              (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               in_stack_fffffffffffff998);
    sVar1 = (in_RDI->value).field_0.pointer[1];
    local_28 = pCVar5;
    sVar6 = map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
            ::size((map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
                    *)((long)&(in_RDI->value).field_0 + 0x28));
    if (sVar1 == sVar6) {
      pvVar2 = (void *)(in_RDI->value).field_0.pointer[4];
      lVar3 = *(long *)((in_RDI->value).field_0.pointer[4] + 0x658);
      (in_RDI->value).field_0.pointer[4] = lVar3;
      if (lVar3 == 0) {
        (in_RDI->value).field_0.pointer[3] = 0;
      }
      else {
        *(undefined8 *)((in_RDI->value).field_0.pointer[4] + 0x660) = 0;
      }
      if (pvVar2 != (void *)0x0) {
        CacheNode::~CacheNode(in_RDI);
        operator_delete(pvVar2,0x670);
      }
    }
    if ((in_RDI->value).field_0.pointer[3] == 0) {
      (in_RDI->value).field_0.pointer[4] = (locType)local_28;
      (in_RDI->value).field_0.pointer[3] = (locType)local_28;
    }
    else {
      pCVar5 = (CacheNode *)(in_RDI->value).field_0.pointer[3];
      local_28->succ = pCVar5;
      pCVar5->prec = local_28;
      (in_RDI->value).field_0.pointer[3] = (locType)local_28;
    }
  }
  else {
    pvVar7 = map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
             ::iterator::operator->(local_20);
    local_28 = pvVar7->second;
    if (local_28 != (CacheNode *)(in_RDI->value).field_0.pointer[3]) {
      local_28->prec->succ = local_28->succ;
      if (local_28->succ == (CacheNode *)0x0) {
        (in_RDI->value).field_0.pointer[4] = (locType)local_28->prec;
      }
      else {
        local_28->succ->prec = local_28->prec;
      }
      local_28->prec = (CacheNode *)0x0;
      pCVar5 = (CacheNode *)(in_RDI->value).field_0.pointer[3];
      local_28->succ = pCVar5;
      pCVar5->prec = local_28;
      (in_RDI->value).field_0.pointer[3] = (locType)local_28;
    }
  }
  return &local_28->value;
}

Assistant:

valueType *load(const locType &offset)
		{
			++ attempt_count;
			typename map<locType , CacheNode*>::iterator it = table.find(offset);
			CacheNode *node;
			if (it == table.end())
			{
				++ miss_count;
				node = new CacheNode (f_read(offset) , offset , this);
				if (block_lim == table.size())
				{
					CacheNode *tmp = tail;
					if (tail = tail -> prec) tail -> succ = nullptr;
					else  head = nullptr;
					delete tmp;
				}
				if (head == nullptr) head = tail = node;
				else (node -> succ = head) -> prec = node , head = node;
			}
			else
			{
				node = it -> second;
				if (node != head)
				{
					node -> prec -> succ = node -> succ;
					if (node -> succ) node -> succ -> prec = node -> prec;
					else tail = node -> prec;
					node -> prec = nullptr , (node -> succ = head) -> prec = node , head = node;
				}
			}
			return &(node -> value);
		}